

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O1

_Bool textui_panel_contains(uint y,uint x)

{
  uint uVar1;
  int iVar2;
  
  if (Term == (term *)0x0) {
    return true;
  }
  if (Term == angband_term[0]) {
    iVar2 = Term->sidebar_mode;
    uVar1 = (Term->hgt - (row_top_map[iVar2] + row_bottom_map[iVar2])) / (int)(uint)tile_height;
    iVar2 = ~col_map[iVar2] + Term->wid;
  }
  else {
    uVar1 = Term->hgt / (int)(uint)tile_height;
    iVar2 = Term->wid;
  }
  if (y - Term->offset_y < uVar1) {
    return x - Term->offset_x < (uint)(iVar2 / (int)(uint)tile_width);
  }
  return false;
}

Assistant:

bool textui_panel_contains(unsigned int y, unsigned int x)
{
	unsigned int hgt;
	unsigned int wid;
	if (!Term)
		return true;
	if (Term == term_screen) {
		hgt = SCREEN_HGT;
		wid = SCREEN_WID;
	} else {
		hgt = Term->hgt / tile_height;
		wid = Term->wid / tile_width;
	}
	return (y - Term->offset_y) < hgt && (x - Term->offset_x) < wid;
}